

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O2

void __thiscall trng::yarn3s::split(yarn3s *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong s_00;
  int iVar5;
  bool bVar6;
  int32_t b [9];
  int32_t a [3];
  
  s_00 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)b,"invalid argument for trng::yarn3s::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)b);
    std::invalid_argument::~invalid_argument((invalid_argument *)b);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    iVar5 = (this->S).r[0];
    jump(this,s_00);
    iVar1 = (this->S).r[0];
    jump(this,s_00);
    iVar2 = (this->S).r[0];
    jump(this,s_00);
    iVar3 = (this->S).r[0];
    jump(this,s_00);
    iVar4 = (this->S).r[0];
    jump(this,s_00);
    a[2] = (this->S).r[0];
    b[0] = iVar2;
    b[1] = iVar1;
    b[2] = iVar5;
    b[3] = iVar3;
    b[4] = iVar2;
    b[5] = iVar1;
    b[6] = iVar4;
    b[7] = iVar3;
    b[8] = iVar2;
    a[0] = iVar3;
    a[1] = iVar4;
    int_math::gauss<3>(&b,&a,0x7fffadb3);
    *(ulong *)(this->P).a = CONCAT44(a[1],a[0]);
    (this->P).a[2] = a[2];
    (this->S).r[0] = iVar2;
    (this->S).r[1] = iVar1;
    (this->S).r[2] = iVar5;
    iVar5 = 3;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      backward(this);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn3s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      int32_t a[3], b[9];
      a[0] = q3;
      b[0] = q2;
      b[1] = q1;
      b[2] = q0;
      a[1] = q4;
      b[3] = q3;
      b[4] = q2;
      b[5] = q1;
      a[2] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      int_math::gauss<3>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      S.r[0] = q2;
      S.r[1] = q1;
      S.r[2] = q0;
      for (int i{0}; i < 3; ++i)
        backward();
    }
  }